

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall wallet::coinselector_tests::waste_test::test_method(waste_test *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  iterator pvVar4;
  iterator in_R9;
  SelectionResult *pSVar5;
  CAmount *pCVar6;
  undefined ***pppuVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  CAmount local_258;
  char *local_250;
  char *local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  CAmount local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  CAmount excess;
  CAmount change_cost;
  SelectionResult selection3;
  SelectionResult selection2;
  SelectionResult selection1;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  change_cost = 0x7d;
  excess = 0x50;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x3c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x3c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x3c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar4;
  file.m_end = (iterator)0x380;
  file.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1c0 = "";
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 0xcd;
  local_240 = (undefined **)SelectionResult::GetWaste(&selection1);
  pSVar5 = &selection3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_1c8,0x380,1,2,pSVar5,"fee_diff * 2 + change_cost",&local_240,
             "selection1.GetWaste()");
  p_Var1 = &selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection2.m_target = 200000000;
  selection2.m_algo = MANUAL;
  selection2.m_use_effective = false;
  selection2.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection2.m_algo_completed = true;
  selection2.m_weight = 0;
  selection2.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  add_coin((CAmount *)&selection3,1,&selection2,200,0x3c);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x3c;
  add_coin((CAmount *)&selection3,2,&selection2,200,0x3c);
  SelectionResult::RecalculateWaste(&selection2,300,0x7d,0x1e);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pSVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x387;
  file_00.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e8,
             msg_00);
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1f0 = "";
  local_240 = (undefined **)SelectionResult::GetWaste(&selection2);
  local_200 = SelectionResult::GetWaste(&selection1);
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,long,long>
            (&selection3,&local_1f8,0x387,1,6,pppuVar7,"selection2.GetWaste()",&local_200,
             "selection1.GetWaste()");
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection3.m_target = 200000000;
  selection3.m_algo = MANUAL;
  selection3.m_use_effective = false;
  selection3.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection3.m_algo_completed = true;
  selection3.m_weight = 0;
  selection3.bump_fee_group_discount = 0;
  local_240 = (undefined **)0x5f5e100;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_coin((CAmount *)&local_240,1,&selection3,100,0x8c);
  local_240 = (undefined **)0xbebc200;
  pvVar4 = (iterator)0x8c;
  add_coin((CAmount *)&local_240,2,&selection3,100,0x8c);
  SelectionResult::RecalculateWaste(&selection3,300,0x7d,0x1e);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pppuVar7;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x38f;
  file_01.m_begin = (iterator)&local_210;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
             msg_01);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_01139f30;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_248 = "";
  local_200 = 0x2d;
  local_258 = SelectionResult::GetWaste(&selection3);
  pvVar4 = (iterator)0x2;
  pCVar6 = &local_200;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_240,&local_250,0x38f,1,2,pCVar6,"fee_diff * -2 + change_cost",&local_258,
             "selection3.GetWaste()");
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar6;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x390;
  file_02.m_begin = (iterator)&local_268;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_278,
             msg_02);
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_01139f30;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_280 = "";
  local_200 = SelectionResult::GetWaste(&selection3);
  local_258 = SelectionResult::GetWaste(&selection1);
  pCVar6 = &local_200;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,long,long>
            (&local_240,&local_288,0x390,1,4,pCVar6,"selection3.GetWaste()",&local_258,
             "selection1.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection3);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection2);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var2 = &selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x3c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x3c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x3c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar6;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x399;
  file_03.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a8,
             msg_03);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2b0 = "";
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 0xa0;
  local_240 = (undefined **)SelectionResult::GetWaste(&selection1);
  pSVar5 = &selection3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_2b8,0x399,1,2,pSVar5,"fee_diff * 2 + excess",&local_240,
             "selection_nochange1.GetWaste()");
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection2.m_target = 0x11e1a1e8;
  selection2.m_algo = MANUAL;
  selection2.m_use_effective = false;
  selection2.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection2.m_algo_completed = true;
  selection2.m_weight = 0;
  selection2.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  add_coin((CAmount *)&selection3,1,&selection2,100,0x8c);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x8c;
  add_coin((CAmount *)&selection3,2,&selection2,100,0x8c);
  SelectionResult::RecalculateWaste(&selection2,300,0x7d,0x1e);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pSVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x3a1;
  file_04.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2d8,
             msg_04);
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2e0 = "";
  local_240 = (undefined **)0x0;
  local_200 = SelectionResult::GetWaste(&selection2);
  pvVar4 = (iterator)0x2;
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection3,&local_2e8,0x3a1,1,2,pppuVar7,"fee_diff * -2 + excess",&local_200,
             "selection_nochange2.GetWaste()");
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pppuVar7;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x3a2;
  file_05.m_begin = (iterator)&local_2f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_308,
             msg_05);
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection3.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_310 = "";
  local_240 = (undefined **)SelectionResult::GetWaste(&selection2);
  local_200 = SelectionResult::GetWaste(&selection1);
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::lt_impl,long,long>
            (&selection3,&local_318,0x3a2,1,4,pppuVar7,"selection_nochange2.GetWaste()",&local_200,
             "selection_nochange1.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection2);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pppuVar7;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x3ab;
  file_06.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_338,
             msg_06);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_340 = "";
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = SelectionResult::GetWaste(&selection1);
  pCVar6 = &change_cost;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_348,0x3ab,1,2,pCVar6,"change_cost",&selection3,
             "selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pCVar6;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x3b4;
  file_07.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_368,
             msg_07);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_370 = "";
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = SelectionResult::GetWaste(&selection1);
  pCVar6 = &excess;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_378,0x3b4,1,2,pCVar6,"excess",&selection3,"selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a238;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,100);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x64;
  add_coin((CAmount *)&selection2,2,&selection1,100,100);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pCVar6;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x3bd;
  file_08.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_398,
             msg_08);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3a0 = "";
  local_240 = (undefined **)((ulong)local_240 & 0xffffffff00000000);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = SelectionResult::GetWaste(&selection1);
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (&selection2,&local_3a8,0x3bd,1,2,pppuVar7,"0",&selection3,"selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x50,0x1e);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pppuVar7;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x3c6;
  file_09.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3c8,
             msg_09);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3d0 = "";
  local_240 = (undefined **)((ulong)local_240 & 0xffffffff00000000);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = SelectionResult::GetWaste(&selection1);
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (&selection2,&local_3d8,0x3c6,1,2,pppuVar7,"0",&selection3,"selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a1e8;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pppuVar7;
  msg_10.m_begin = pvVar4;
  file_10.m_end = (iterator)0x3d0;
  file_10.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3f8,
             msg_10);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_400 = "";
  local_240 = (undefined **)((ulong)local_240 & 0xffffffff00000000);
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = SelectionResult::GetWaste(&selection1);
  pppuVar7 = &local_240;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long>
            (&selection2,&local_408,0x3d0,1,2,&local_240,"0",&selection3,"selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 0x11e1a238;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 0xffffffffffffffb0;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,0x8c);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0x8c;
  add_coin((CAmount *)&selection2,2,&selection1,100,0x8c);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pppuVar7;
  msg_11.m_begin = pvVar4;
  file_11.m_end = (iterator)0x3da;
  file_11.m_begin = (iterator)&local_418;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_428,
             msg_11);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_430 = "";
  local_240 = (undefined **)SelectionResult::GetWaste(&selection1);
  pSVar5 = &selection3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_438,0x3da,1,2,pSVar5,"target_waste1",&local_240,
             "selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection1.m_target = 200000000;
  selection1.m_algo = MANUAL;
  selection1.m_use_effective = false;
  selection1.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection1.m_algo_completed = true;
  selection1.m_weight = 0;
  selection1.bump_fee_group_discount = 0;
  selection3.m_selected_inputs._M_t._M_impl._0_8_ = 0xffffffffffffffc9;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 100000000;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection1.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&selection2,1,&selection1,100,0xbe);
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = 200000000;
  pvVar4 = (iterator)0xbe;
  add_coin((CAmount *)&selection2,2,&selection1,100,0xbe);
  SelectionResult::RecalculateWaste(&selection1,300,0x7d,0x1e);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pSVar5;
  msg_12.m_begin = pvVar4;
  file_12.m_end = (iterator)0x3e9;
  file_12.m_begin = (iterator)&local_448;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_458,
             msg_12);
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
       0xffffff00;
  selection2.m_selected_inputs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  selection2.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0xc694e1;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_460 = "";
  local_240 = (undefined **)SelectionResult::GetWaste(&selection1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&selection2,&local_468,0x3e9,1,2,&selection3,"target_waste2",&local_240,
             "selection.GetWaste()");
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(waste_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{300};
    const CAmount change_cost{125};
    const CAmount change_fee{30};
    const CAmount fee_diff{40};
    const CAmount in_amt{3 * COIN};
    const CAmount target{2 * COIN};
    const CAmount excess{80};
    const CAmount exact_target{in_amt - fee * 2}; // Maximum spendable amount after fees: no change, no excess

    // In the following, we test that the waste is calculated correctly in various scenarios.
    // Usually, RecalculateWaste would compute change_fee and change_cost on basis of the
    // change output type, current feerate, and discard_feerate, but we use fixed values
    // across this test to make the test easier to understand.
    {
        // Waste with change is the change cost and difference between fee and long term fee
        SelectionResult selection1{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection1, /*fee=*/fee, /*long_term_fee=*/fee - fee_diff);
        add_coin(2 * COIN, 2, selection1, fee, fee - fee_diff);
        selection1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + change_cost, selection1.GetWaste());

        // Waste will be greater when fee is greater, but long term fee is the same
        SelectionResult selection2{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection2, fee * 2, fee - fee_diff);
        add_coin(2 * COIN, 2, selection2, fee * 2, fee - fee_diff);
        selection2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_GT(selection2.GetWaste(), selection1.GetWaste());

        // Waste with change is the change cost and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection3{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection3, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection3, fee, fee + fee_diff);
        selection3.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + change_cost, selection3.GetWaste());
        BOOST_CHECK_LT(selection3.GetWaste(), selection1.GetWaste());
    }

    {
        // Waste without change is the excess and difference between fee and long term fee
        SelectionResult selection_nochange1{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange1, fee, fee - fee_diff);
        add_coin(2 * COIN, 2, selection_nochange1, fee, fee - fee_diff);
        selection_nochange1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + excess, selection_nochange1.GetWaste());

        // Waste without change is the excess and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection_nochange2{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange2, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection_nochange2, fee, fee + fee_diff);
        selection_nochange2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + excess, selection_nochange2.GetWaste());
        BOOST_CHECK_LT(selection_nochange2.GetWaste(), selection_nochange1.GetWaste());
    }

    {
        // Waste with change and fee == long term fee is just cost of change
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(change_cost, selection.GetWaste());
    }

    {
        // Waste without change and fee == long term fee is just the excess
        SelectionResult selection{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(excess, selection.GetWaste());
    }

    {
        // Waste is 0 when fee == long_term_fee, no change, and no excess
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost , change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-cost_of_change), and no excess
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, /*change_cost=*/fee_diff * 2, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-excess), no change cost
        const CAmount new_target{exact_target - /*excess=*/fee_diff * 2};
        SelectionResult selection{new_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and the selected value == target
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        const CAmount target_waste1{-2 * fee_diff}; // = (2 * fee) - (2 * (fee + fee_diff))
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste1, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and change_cost < - (inputs * (fee - long_term_fee))
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        const CAmount large_fee_diff{90};
        const CAmount target_waste2{-2 * large_fee_diff + change_cost};
        // = (2 * fee) - (2 * (fee + large_fee_diff)) + change_cost
        // = (2 * 100) - (2 * (100 + 90)) + 125
        // = 200 - 380 + 125 = -55
        assert(target_waste2 == -55);
        add_coin(1 * COIN, 1, selection, fee, fee + large_fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + large_fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste2, selection.GetWaste());
    }
}